

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O3

void __thiscall BoardView::RenderOverlay(BoardView *this)

{
  ShowInfoPane(this);
  if (this->m_showNetList == true) {
    ShowNetList(this,&this->m_showNetList);
  }
  if (this->m_showPartList == true) {
    ShowPartList(this,&this->m_showPartList);
    return;
  }
  return;
}

Assistant:

void BoardView::RenderOverlay() {

	ShowInfoPane();

	// Listing of Net elements
	if (m_showNetList) {
		ShowNetList(&m_showNetList);
	}
	if (m_showPartList) {
		ShowPartList(&m_showPartList);
	}
}